

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

int run_test_fork_socketpair(void)

{
  int iVar1;
  __pid_t child_pid_00;
  uv_loop_t *puVar2;
  ssize_t sVar3;
  undefined1 local_b8 [8];
  uv_poll_t poll_handle;
  int local_10;
  int socket_fds [2];
  pid_t child_pid;
  
  run_timer_loop_once();
  iVar1 = socketpair(1,1,0,(int *)&poll_handle.io_watcher.field_0x34);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x81,"0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_poll_init(puVar2,(uv_poll_t *)local_b8,poll_handle.io_watcher._52_4_);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x84,"0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0])");
    abort();
  }
  child_pid_00 = fork();
  if (child_pid_00 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x87,"child_pid != -1");
    abort();
  }
  if (child_pid_00 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(puVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
              ,0x8f,"0 == uv_loop_fork(uv_default_loop())");
      abort();
    }
    if (socket_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
              ,0x90,"0 == socket_cb_called");
      abort();
    }
    iVar1 = uv_poll_start((uv_poll_t *)local_b8,1,socket_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
              ,0x91,"0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb)");
      abort();
    }
    printf("Going to run the loop in the child\n");
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
              ,0x93,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
      abort();
    }
    if (socket_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
              ,0x94,"1 == socket_cb_called");
      abort();
    }
  }
  else {
    sVar3 = send(local_10,"hi\n",3,0);
    if (sVar3 != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
              ,0x8b,"3 == send(socket_fds[1], \"hi\\n\", 3, 0)");
      abort();
    }
    assert_wait_child(child_pid_00);
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c",
          0x97,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(fork_socketpair) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork. */
  pid_t child_pid;
  int socket_fds[2];
  uv_poll_t poll_handle;

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);
    ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));
    printf("Going to run the loop in the child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}